

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgParser.cpp
# Opt level: O2

void __thiscall ArgParser::defaultValues(ArgParser *this)

{
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->output_file);
  this->width = 100;
  this->height = 100;
  this->iters = 10;
  this->length = 1.0;
  std::__cxx11::string::assign((char *)&this->log_file);
  return;
}

Assistant:

void
ArgParser::defaultValues() {
    // rendering output
    input_file = "";
    output_file = "";
    width = 100;
    height = 100;

    // rendering options
    iters = 10;
    length = 1.f;

    // logging
    log_file = "";
}